

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * lexer::terminalName(string *__return_storage_ptr__,Terminal terminal,
                            TerminalNames *terminalNames)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  stringstream stringstream;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  p_Var3 = &(terminalNames->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (terminalNames->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < terminal])
  {
    if (terminal <= (int)p_Var2[1]._M_color) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, terminal < (int)p_Var1[1]._M_color)
     ) {
    p_Var2 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::ostream::operator<<(local_188,terminal);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
    std::ios_base::~ios_base(local_118);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var2[1]._M_parent,
               (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string terminalName(Terminal terminal, TerminalNames const& terminalNames) {
        TerminalNames::const_iterator it = terminalNames.find(terminal);
        if (it == terminalNames.end()) {
            std::stringstream stringstream;
            stringstream << terminal;
            return stringstream.str();
        }
        return it->second;
    }